

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O0

void __thiscall
BronKerbosch::addAlignment
          (BronKerbosch *this,
          unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *alignment_autoptr,
          int *edgecounter,int *nonEdgeCounter,int numGCAllowedPos,int ct)

{
  long *plVar1;
  const_iterator __position;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *pmVar2;
  bool bVar3;
  uint v1;
  uint uVar4;
  undefined8 *puVar5;
  reference pppVar6;
  reference ppAVar7;
  size_type sVar8;
  ulong uVar9;
  LogWriter *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>,_bool>
  pVar10;
  size_type ind;
  AlignmentRecord *alignment2;
  iterator it;
  adjacency_list_t *vertex;
  size_t index;
  AlignmentRecord *alignment;
  alignment_id_t id;
  list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
  *in_stack_fffffffffffffe98;
  pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
  *in_stack_fffffffffffffeb0;
  allocator_type *in_stack_fffffffffffffeb8;
  map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
  *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>
  in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffef8;
  _List_const_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
  local_d8;
  _List_node_base *local_d0;
  _Base_ptr local_c8;
  undefined1 local_c0;
  size_type local_98;
  AlignmentRecord *local_90;
  _Self local_88;
  _Self local_80;
  undefined1 local_75;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 *local_48;
  _Base_ptr local_40;
  pointer local_38;
  alignment_id_t local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  local_2c = *(alignment_id_t *)&(in_RDI->cliques_)._M_t._M_impl;
  *(alignment_id_t *)&(in_RDI->cliques_)._M_t._M_impl = local_2c + 1;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_38 = std::unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_>::release
                       ((unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *)
                        0x257c62);
  AlignmentRecord::setID(local_38,local_2c);
  local_40 = (in_RDI->vertices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  (in_RDI->vertices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)((long)&local_40->_M_color + 1);
  std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::push_back
            ((vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
             in_stack_fffffffffffffeb0,
             (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  puVar5 = (undefined8 *)operator_new(0x20);
  local_75 = 1;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)0x257cf2);
  std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>::
  pair<unsigned_long_&,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>,_true>
            (in_stack_fffffffffffffea0,(unsigned_long *)in_stack_fffffffffffffe98,
             (list<unsigned_long,_std::allocator<unsigned_long>_> *)0x257d0c);
  local_75 = 0;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)0x257d23);
  local_48 = puVar5;
  std::
  vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
  ::push_back((vector<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
               *)in_stack_fffffffffffffeb0,
              (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_80._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
       ::begin(in_stack_fffffffffffffe98);
LAB_00257d5c:
  while( true ) {
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
         ::end(in_stack_fffffffffffffe98);
    bVar3 = std::operator!=(&local_80,&local_88);
    if (!bVar3) {
      std::__cxx11::
      list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
      ::push_back((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                   *)in_stack_fffffffffffffeb0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      return;
    }
    pmVar2 = &in_RDI->cliques_;
    pppVar6 = std::
              _List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
              ::operator*((_List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                           *)0x257dab);
    ppAVar7 = std::vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::operator[]
                        ((vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)
                         &(pmVar2->_M_t)._M_impl.super__Rb_tree_header,(*pppVar6)->first);
    local_90 = *ppAVar7;
    v1 = AlignmentRecord::getIntervalStart(local_38);
    uVar4 = AlignmentRecord::getIntervalEnd(local_90);
    if (v1 <= uVar4) break;
    std::
    _List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
    ::operator*((_List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                 *)0x257dff);
    local_98 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((list<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffea0);
    sVar8 = std::
            map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
            ::count(in_stack_fffffffffffffeb0,
                    (key_type_conflict1 *)
                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (sVar8 == 0) {
      std::
      _List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
      ::operator*((_List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                   *)0x257e51);
      std::
      allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
      ::allocator((allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                   *)0x257e68);
      std::__cxx11::
      list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
      ::list((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
              *)in_stack_fffffffffffffed0._M_node,
             CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
             (value_type *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      pVar10 = std::
               map<unsigned_long,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
               ::
               emplace<unsigned_long&,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>
                         (in_stack_fffffffffffffeb0,
                          (unsigned_long *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                          (list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                           *)in_stack_fffffffffffffea0);
      in_stack_fffffffffffffed0 = pVar10.first._M_node;
      in_stack_fffffffffffffecf = pVar10.second;
      local_c8 = in_stack_fffffffffffffed0._M_node;
      local_c0 = in_stack_fffffffffffffecf;
      std::__cxx11::
      list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
      ::~list((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
               *)0x257ed0);
      std::
      allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
      ::~allocator((allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                    *)0x257edd);
    }
    else {
      in_stack_fffffffffffffec0 =
           (map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
            *)std::
              map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
              ::at(in_stack_fffffffffffffec0,(key_type_conflict1 *)in_stack_fffffffffffffeb8);
      std::
      _List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
      ::operator*((_List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                   *)0x257f8f);
      std::__cxx11::
      list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
      ::push_back((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                   *)in_stack_fffffffffffffeb0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    }
    in_stack_fffffffffffffeb8 = *(allocator_type **)&in_RDI->field_0x70;
    std::
    _List_const_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
    ::_List_const_iterator(&local_d8,&local_80);
    __position._M_node._4_4_ = in_stack_fffffffffffffeac;
    __position._M_node._0_4_ = in_stack_fffffffffffffea8;
    local_d0 = (_List_node_base *)
               std::__cxx11::
               list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
               ::erase((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                        *)in_stack_fffffffffffffea0,__position);
    local_80._M_node = local_d0;
  }
  plVar1 = *(long **)&(in_RDI->vertices_)._M_t._M_impl;
  uVar9 = (**(code **)(*plVar1 + 0x10))(plVar1,local_38,local_90,local_24,local_28);
  if ((uVar9 & 1) != 0) goto LAB_00258025;
  goto LAB_00258116;
LAB_00258025:
  if (((in_RDI->vertices_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     (plVar1 = (long *)(in_RDI->vertices_)._M_t._M_impl.super__Rb_tree_header._M_node_count,
     uVar9 = (**(code **)(*plVar1 + 0x10))(plVar1,local_38,local_90,local_24,local_28),
     (uVar9 & 1) != 0)) {
    in_stack_fffffffffffffeb0 =
         (map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
          *)std::
            get<1ul,unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>
                      ((pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)0x258077);
    std::
    _List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
    ::operator*((_List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                 *)0x258089);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0,
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
              );
    std::
    _List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
    ::operator*((_List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                 *)0x2580a3);
    std::get<1ul,unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>
              ((pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)0x2580ab);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0,
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
              );
    if (*(long *)&in_RDI->field_0x80 != 0) {
      in_stack_fffffffffffffea0 =
           *(pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
             **)&in_RDI->field_0x80;
      in_stack_fffffffffffffeac = (undefined4)*local_48;
      std::
      _List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
      ::operator*((_List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
                   *)0x2580f7);
      LogWriter::reportEdge(in_RDI,v1,in_stack_fffffffffffffef8);
    }
    *(undefined1 *)
     ((long)&(in_RDI->vertices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1) = 0;
LAB_00258116:
    std::
    _List_iterator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>
    ::operator++(&local_80,0);
  }
  goto LAB_00257d5c;
}

Assistant:

void BronKerbosch::addAlignment(std::unique_ptr<AlignmentRecord>& alignment_autoptr, int& edgecounter, int &nonEdgeCounter, int numGCAllowedPos, int ct) {
	assert(alignment_autoptr.get() != nullptr);
	assert(cliques!=nullptr);
    assert(initialized);

	alignment_id_t id = next_id++;
	AlignmentRecord* alignment = alignment_autoptr.release();
	alignment->setID(id);

	size_t index = alignment_count++;
	alignments_.push_back(alignment);

    adjacency_list_t* vertex = new adjacency_list_t(index, list<size_t>());

    vertices_as_lists_->push_back(vertex);

    for (auto it = actives_->begin(); it != actives_->end();) {
        AlignmentRecord* alignment2 = alignments_[(*it)->first];

        if (alignment->getIntervalStart() > alignment2->getIntervalEnd()) {
            list<adjacency_list_t*>::size_type ind = (*it)->second.size();

            if(degree_map_->count(ind) == 0) {           
                degree_map_->emplace(ind, list<adjacency_list_t*>(1, *it) );
//		degree_map_->insert(std::pair<std::list<adjacency_list_t*>::size_type, std::list<adjacency_list_t*>> (ind, list<adjacency_list_t*>(1, *it)));
            } else {
                degree_map_->at(ind).push_back(*it);
            }
            
            it = actives_->erase(it);
            continue;
        }

        if(edge_calculator.edgeBetween(*alignment, *alignment2,numGCAllowedPos,ct) ) {

            if(second_edge_calculator != nullptr) {
                if(not second_edge_calculator->edgeBetween(*alignment, *alignment2,numGCAllowedPos,ct) ) {
                    continue;
                }
            }

            // Draw edge between current alignment and old alignment in vert
            get<1>(*vertex).push_back((*it)->first);
            get<1>(**it).push_back(vertex->first);

            if (lw != nullptr) lw->reportEdge(vertex->first, (*it)->first);

            converged = false;
        }
        it++;
    }

    actives_->push_back(vertex);

}